

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O0

void __thiscall
CVmObjList::restore_from_file(CVmObjList *this,vm_obj_id_t param_2,CVmFile *fp,CVmObjFixup *fixups)

{
  uint uVar1;
  CVmVarHeap *pCVar2;
  CVmObjFixup *in_RCX;
  char *buf;
  CVmFile *in_RDI;
  size_t cnt;
  size_t in_stack_ffffffffffffffc8;
  
  uVar1 = CVmFile::read_uint2(in_RDI);
  buf = (char *)(ulong)uVar1;
  if (in_RDI->seek_base_ != 0) {
    pCVar2 = CVmMemory::get_var_heap(G_mem_X);
    (*pCVar2->_vptr_CVmVarHeap[6])(pCVar2,in_RDI->seek_base_);
    in_RDI->seek_base_ = 0;
  }
  alloc_list((CVmObjList *)in_RCX,(size_t)buf);
  vmb_put_len((char *)in_RDI,in_stack_ffffffffffffffc8);
  CVmFile::read_bytes((CVmFile *)in_RCX,buf,(size_t)in_RDI);
  CVmObjFixup::fix_dh_array(in_RCX,buf,(size_t)in_RDI);
  return;
}

Assistant:

void CVmObjList::restore_from_file(VMG_ vm_obj_id_t,
                                   CVmFile *fp, CVmObjFixup *fixups)
{
    size_t cnt;

    /* read the element count */
    cnt = fp->read_uint2();

    /* free any existing extension */
    if (ext_ != 0)
    {
        G_mem->get_var_heap()->free_mem(ext_);
        ext_ = 0;
    }

    /* allocate the space */
    alloc_list(vmg_ cnt);

    /* store our element count */
    vmb_put_len(ext_, cnt);

    /* read the contents, if there are any elements */
    fp->read_bytes(ext_ + VMB_LEN, cnt * VMB_DATAHOLDER);

    /* fix object references */
    fixups->fix_dh_array(vmg_ ext_ + VMB_LEN, cnt);
}